

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tzfmt.cpp
# Opt level: O0

int32_t __thiscall
icu_63::TimeZoneFormat::parseOffsetFieldWithLocalizedDigits
          (TimeZoneFormat *this,UnicodeString *text,int32_t start,uint8_t minDigits,
          uint8_t maxDigits,uint16_t minVal,uint16_t maxVal,int32_t *parsedLen)

{
  int32_t iVar1;
  int32_t iVar2;
  int iVar3;
  int32_t tmpVal;
  int32_t digit;
  int32_t digitLen;
  int32_t idx;
  int32_t numDigits;
  int32_t decVal;
  uint16_t minVal_local;
  uint8_t maxDigits_local;
  uint8_t minDigits_local;
  int32_t start_local;
  UnicodeString *text_local;
  TimeZoneFormat *this_local;
  
  *parsedLen = 0;
  idx = 0;
  digitLen = 0;
  tmpVal = 0;
  digit = start;
  numDigits._0_2_ = minVal;
  numDigits._2_1_ = maxDigits;
  numDigits._3_1_ = minDigits;
  decVal = start;
  _minVal_local = text;
  text_local = (UnicodeString *)this;
  while (((iVar2 = digit, iVar1 = UnicodeString::length(_minVal_local),
          iVar2 < iVar1 && digitLen < (int)(uint)numDigits._2_1_ &&
          (iVar2 = parseSingleLocalizedDigit(this,_minVal_local,digit,&tmpVal), -1 < iVar2)) &&
         (iVar3 = idx * 10 + iVar2, iVar3 <= (int)(uint)maxVal))) {
    digitLen = digitLen + 1;
    digit = tmpVal + digit;
    idx = iVar3;
  }
  if ((digitLen < (int)(uint)numDigits._3_1_) || (idx < (int)(uint)(uint16_t)numDigits)) {
    idx = -1;
  }
  else {
    *parsedLen = digit - decVal;
  }
  return idx;
}

Assistant:

int32_t
TimeZoneFormat::parseOffsetFieldWithLocalizedDigits(const UnicodeString& text, int32_t start, uint8_t minDigits, uint8_t maxDigits, uint16_t minVal, uint16_t maxVal, int32_t& parsedLen) const {
    parsedLen = 0;

    int32_t decVal = 0;
    int32_t numDigits = 0;
    int32_t idx = start;
    int32_t digitLen = 0;

    while (idx < text.length() && numDigits < maxDigits) {
        int32_t digit = parseSingleLocalizedDigit(text, idx, digitLen);
        if (digit < 0) {
            break;
        }
        int32_t tmpVal = decVal * 10 + digit;
        if (tmpVal > maxVal) {
            break;
        }
        decVal = tmpVal;
        numDigits++;
        idx += digitLen;
    }

    // Note: maxVal is checked in the while loop
    if (numDigits < minDigits || decVal < minVal) {
        decVal = -1;
        numDigits = 0;
    } else {
        parsedLen = idx - start;
    }

    return decVal;
}